

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fStencilTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::StencilShader::shadeFragments
          (StencilShader *this,FragmentPacket *packets,int numPackets,
          FragmentShadingContext *context)

{
  int local_40;
  int local_3c;
  int fragNdx;
  int packetNdx;
  Vec4 color;
  FragmentShadingContext *context_local;
  int numPackets_local;
  FragmentPacket *packets_local;
  StencilShader *this_local;
  
  color.m_data._8_8_ = context;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&fragNdx,(float (*) [4])&this->u_color->value);
  for (local_3c = 0; local_3c < numPackets; local_3c = local_3c + 1) {
    for (local_40 = 0; local_40 < 4; local_40 = local_40 + 1) {
      rr::writeFragmentOutput<tcu::Vector<float,4>>
                ((FragmentShadingContext *)color.m_data._8_8_,local_3c,local_40,0,
                 (Vector<float,_4> *)&fragNdx);
    }
  }
  return;
}

Assistant:

void shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
	{
		const tcu::Vec4 color(u_color.value.f4);

		DE_UNREF(packets);

		for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
			rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, color);
	}